

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

_Bool ggml_are_same_shape(ggml_tensor *t0,ggml_tensor *t1)

{
  _Bool local_11;
  ggml_tensor *t1_local;
  ggml_tensor *t0_local;
  
  local_11 = false;
  if (((t0->ne[0] == t1->ne[0]) && (local_11 = false, t0->ne[1] == t1->ne[1])) &&
     (local_11 = false, t0->ne[2] == t1->ne[2])) {
    local_11 = t0->ne[3] == t1->ne[3];
  }
  return local_11;
}

Assistant:

bool ggml_are_same_shape(const struct ggml_tensor * t0, const struct ggml_tensor * t1) {
    static_assert(GGML_MAX_DIMS == 4, "GGML_MAX_DIMS is not 4 - update this function");

    return
        (t0->ne[0] == t1->ne[0]) &&
        (t0->ne[1] == t1->ne[1]) &&
        (t0->ne[2] == t1->ne[2]) &&
        (t0->ne[3] == t1->ne[3]);
}